

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall minibag::TimePublisher::TimePublisher(TimePublisher *this)

{
  Publisher *this_00;
  long in_RDI;
  bool in_stack_0000008b;
  uint32_t in_stack_0000008c;
  string *in_stack_00000090;
  NodeHandle *in_stack_00000098;
  Publisher *in_stack_ffffffffffffff18;
  TimePublisher *in_stack_ffffffffffffff20;
  string *this_01;
  map *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_98 [32];
  Publisher local_78 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  string local_28 [40];
  
  *(undefined8 *)(in_RDI + 0x10) = 0x3ff0000000000000;
  this_01 = local_28;
  std::__cxx11::string::string(this_01);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  __s = (map *)&local_58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1c07b2);
  miniros::NodeHandle::NodeHandle((NodeHandle *)(in_RDI + 0x18),this_01,__s);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1c07d5);
  std::__cxx11::string::~string(local_28);
  miniros::Publisher::Publisher((Publisher *)0x1c07f8);
  miniros::WallDuration::WallDuration((WallDuration *)0x1c0810);
  miniros::WallTime::WallTime((WallTime *)0x1c0823);
  miniros::WallTime::WallTime((WallTime *)0x1c0836);
  miniros::Time::Time((Time *)0x1c0849);
  miniros::Time::Time((Time *)0x1c085c);
  setPublishFrequency(in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
  this_00 = (Publisher *)(in_RDI + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)__s,(allocator<char> *)this_01);
  miniros::NodeHandle::advertise<rosgraph_msgs::Clock_<std::allocator<void>>>
            (in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_0000008b);
  miniros::Publisher::operator=(this_00,in_stack_ffffffffffffff18);
  miniros::Publisher::~Publisher(local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  return;
}

Assistant:

TimePublisher::TimePublisher() : time_scale_(1.0)
{
  setPublishFrequency(-1.0);
  time_pub_ = node_handle_.advertise<rosgraph_msgs::Clock>("clock",1);
}